

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void * stb_sparse_ptr_matrix_get(stb_spmatrix *z,void *a,void *b,int create)

{
  stb__stb__spmatrix__hashpair *psVar1;
  uchar uVar2;
  stb__stb__spmatrix__hashpair *psVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  void **ppvVar7;
  void *__s;
  int unaff_EBX;
  ulong uVar8;
  uint uVar9;
  int allow_old;
  undefined1 *in_R9;
  stb__ptrpair k;
  stb__ptrpair k_00;
  
  k.b = b;
  k.a = a;
  uVar5 = stb__stb__spmatrix_hash(k);
  if ((undefined1 *)b == &DAT_00000001 && (undefined1 *)a == &DAT_00000001) {
    lVar6 = 0x38;
    uVar2 = z->has_empty;
joined_r0x0015114d:
    if (uVar2 != '\0') {
      ppvVar7 = (void **)((long)&z->val_size + lVar6);
LAB_001511d0:
      __s = *ppvVar7;
      goto LAB_001511d8;
    }
  }
  else {
    if ((undefined1 *)b == &DAT_00000002 && (undefined1 *)a == &DAT_00000002) {
      lVar6 = 0x40;
      uVar2 = z->has_del;
      goto joined_r0x0015114d;
    }
    uVar9 = z->mask & uVar5;
    psVar3 = z->table;
    uVar8 = (ulong)uVar9;
    psVar1 = psVar3 + uVar8;
    in_R9 = (undefined1 *)(psVar1->k).a;
    if ((in_R9 != &DAT_00000001) || ((undefined1 *)(psVar1->k).b != &DAT_00000001)) {
      if ((in_R9 != (undefined1 *)a) || ((psVar1->k).b != b)) {
        __s = (void *)0x0;
        uVar8 = (ulong)uVar9;
        do {
          uVar8 = (ulong)((int)uVar8 + ((uVar5 >> 0x13) + (uVar5 >> 6) + uVar5 | 1) & z->mask);
          psVar1 = psVar3 + uVar8;
          puVar4 = (undefined1 *)(psVar1->k).a;
          if ((puVar4 == &DAT_00000001) && ((undefined1 *)(psVar1->k).b == &DAT_00000001))
          goto LAB_001511d8;
        } while ((puVar4 != (undefined1 *)a) || ((psVar1->k).b != b));
      }
      ppvVar7 = &psVar3[uVar8].v;
      goto LAB_001511d0;
    }
  }
  __s = (void *)0x0;
LAB_001511d8:
  allow_old = (int)in_R9;
  if ((create != 0) && (__s == (void *)0x0)) {
    __s = malloc_base(z->arena,(long)z->val_size,STB__chunk_raw,stb_alloc_alignment);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)z->val_size);
      k_00.b = b;
      k_00.a = a;
      stb__stb__spmatrix_addset(z,k_00,__s,0,allow_old,unaff_EBX);
    }
  }
  return __s;
}

Assistant:

void *stb_sparse_ptr_matrix_get(stb_spmatrix *z, void *a, void *b, int create)
{
   stb__ptrpair t = { a,b };
   void *data = stb__spmatrix_get(z, t);
   if (!data && create) {
      data = stb_malloc_raw(z->arena, z->val_size);
      if (!data) return NULL;
      memset(data, 0, z->val_size);
      stb__spmatrix_add(z, t, data);
   }
   return data;
}